

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTest.cpp
# Opt level: O0

bool __thiscall CaptureCborTest::DoTest(CaptureCborTest *this)

{
  byte bVar1;
  undefined1 local_250 [8];
  CaptureSummary tcs;
  char *pcStack_228;
  bool ret;
  char *list [1];
  undefined1 local_210 [8];
  CaptureSummary cs;
  DnsStats capture;
  CaptureCborTest *this_local;
  
  DnsStats::DnsStats((DnsStats *)
                     &cs.summary.
                      super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  CaptureSummary::CaptureSummary((CaptureSummary *)local_210);
  pcStack_228 = cbor_input_test;
  tcs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ =
       DnsStats::LoadCborFiles
                 ((DnsStats *)
                  &cs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,1,&stack0xfffffffffffffdd8);
  if (((bool)tcs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_) &&
     (tcs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ =
           DnsStats::ExportToCaptureSummary
                     ((DnsStats *)
                      &cs.summary.
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage,(CaptureSummary *)local_210),
     (bool)tcs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage._7_1_)) {
    CaptureSummary::CaptureSummary((CaptureSummary *)local_250);
    tcs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ =
         CaptureSummary::Load((CaptureSummary *)local_250,cbor_test_output);
    if ((bool)tcs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_) {
      CaptureSummary::Sort((CaptureSummary *)local_210);
      CaptureSummary::Sort((CaptureSummary *)local_250);
      tcs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ =
           ithi_test_class::CompareCS((CaptureSummary *)local_210,(CaptureSummary *)local_250);
      if (!(bool)tcs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_) {
        CaptureSummary::Save((CaptureSummary *)local_210,cbor_test_debug);
      }
    }
    CaptureSummary::~CaptureSummary((CaptureSummary *)local_250);
  }
  bVar1 = tcs.summary.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_;
  CaptureSummary::~CaptureSummary((CaptureSummary *)local_210);
  DnsStats::~DnsStats((DnsStats *)
                      &cs.summary.
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  return (bool)(bVar1 & 1);
}

Assistant:

bool CaptureCborTest::DoTest()
{
    DnsStats capture;
    CaptureSummary cs;
    char const* list[1] = { cbor_input_test };
    bool ret = capture.LoadCborFiles(1, list);

    if (ret)
    {
        ret = capture.ExportToCaptureSummary(&cs);

        if (ret)
        {
            CaptureSummary tcs;

            ret = tcs.Load(cbor_test_output);

            if (ret)
            {
                cs.Sort();
                tcs.Sort();

                ret = ithi_test_class::CompareCS(&cs, &tcs);

                if (!ret)
                {
                    cs.Save(cbor_test_debug);
                }
            }
        }
    }

    return ret;
}